

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Effects_Buffer.cpp
# Opt level: O0

void __thiscall Effects_Buffer::mix_mono(Effects_Buffer *this,blip_sample_t *out_,blargg_long count)

{
  undefined4 uVar1;
  short sVar2;
  int iVar3;
  blip_long bVar4;
  byte bVar5;
  int *piVar7;
  int s;
  blargg_long cs1;
  blargg_long cs0;
  blargg_long n;
  blip_long c_reader_accum;
  buf_t_ *c_reader_buf;
  int bass;
  blip_sample_t *out;
  blargg_long count_local;
  blip_sample_t *out__local;
  Effects_Buffer *this_local;
  int iVar6;
  
  uVar1 = *(undefined4 *)&this->field_0x38;
  c_reader_buf = *(buf_t_ **)&this->field_0x28;
  c_reader_accum = *(blip_long *)&this->field_0x34;
  n = count >> 1;
  out = out_;
  while( true ) {
    cs0 = c_reader_accum >> 0xe;
    sVar2 = (short)cs0;
    iVar6 = c_reader_accum >> 0x1f;
    bVar5 = (byte)uVar1;
    if (n == 0) break;
    piVar7 = c_reader_buf + 1;
    iVar3 = (*c_reader_buf - (c_reader_accum >> (bVar5 & 0x1f))) + c_reader_accum;
    cs1 = iVar3 >> 0xe;
    c_reader_buf = c_reader_buf + 2;
    c_reader_accum = (*piVar7 - (iVar3 >> (bVar5 & 0x1f))) + iVar3;
    if (sVar2 != cs0) {
      cs0 = 0x7fff - iVar6;
    }
    *(uint *)out = cs0 & 0xffffU | cs0 << 0x10;
    if ((short)cs1 != cs1) {
      cs1 = 0x7fff - (iVar3 >> 0x1f);
    }
    *(uint *)(out + 2) = cs1 & 0xffffU | cs1 << 0x10;
    out = out + 4;
    n = n + -1;
  }
  bVar4 = c_reader_accum;
  if ((count & 1U) != 0) {
    bVar4 = (*c_reader_buf - (c_reader_accum >> (bVar5 & 0x1f))) + c_reader_accum;
    *out = sVar2;
    out[1] = sVar2;
    if (sVar2 != cs0) {
      sVar2 = 0x7fff - (short)(c_reader_accum >> 0x1f);
      *out = sVar2;
      out[1] = sVar2;
    }
  }
  c_reader_accum = bVar4;
  *(blip_long *)&this->field_0x34 = c_reader_accum;
  return;
}

Assistant:

void Effects_Buffer::mix_mono( blip_sample_t* out_, blargg_long count )
{
	blip_sample_t* BLIP_RESTRICT out = out_;
	int const bass = BLIP_READER_BASS( bufs [0] );
	BLIP_READER_BEGIN( c, bufs [0] );
	
	// unrolled loop
	for ( blargg_long n = count >> 1; n; --n )
	{
		blargg_long cs0 = BLIP_READER_READ( c );
		BLIP_READER_NEXT( c, bass );
		
		blargg_long cs1 = BLIP_READER_READ( c );
		BLIP_READER_NEXT( c, bass );
		
		if ( (BOOST::int16_t) cs0 != cs0 )
			cs0 = 0x7FFF - (cs0 >> 24);
		((BOOST::uint32_t*) out) [0] = ((BOOST::uint16_t) cs0) | (cs0 << 16);
		
		if ( (BOOST::int16_t) cs1 != cs1 )
			cs1 = 0x7FFF - (cs1 >> 24);
		((BOOST::uint32_t*) out) [1] = ((BOOST::uint16_t) cs1) | (cs1 << 16);
		out += 4;
	}
	
	if ( count & 1 )
	{
		int s = BLIP_READER_READ( c );
		BLIP_READER_NEXT( c, bass );
		out [0] = s;
		out [1] = s;
		if ( (BOOST::int16_t) s != s )
		{
			s = 0x7FFF - (s >> 24);
			out [0] = s;
			out [1] = s;
		}
	}
	
	BLIP_READER_END( c, bufs [0] );
}